

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void EncodeContextMap(MemoryManager *m,uint32_t *context_map,size_t context_map_size,
                     size_t num_clusters,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *p;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  char cVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  undefined8 local_7b0;
  uint32_t histogram [272];
  uint8_t depths [272];
  uint16_t bits [272];
  
  local_7b0 = tree;
  StoreVarLenUint8(num_clusters - 1,storage_ix,storage);
  if (num_clusters != 1) {
    p = BrotliAllocate(m,context_map_size * 4);
    uVar3 = *context_map;
    for (uVar4 = 1; uVar4 < context_map_size; uVar4 = uVar4 + 1) {
      if (uVar3 < context_map[uVar4]) {
        uVar3 = context_map[uVar4];
      }
    }
    for (lVar9 = 0; (ulong)uVar3 + 1 != lVar9; lVar9 = lVar9 + 1) {
      *(char *)((long)histogram + lVar9) = (char)lVar9;
    }
    uVar4 = (ulong)(uVar3 + 1);
    for (sVar5 = 0; sVar5 != context_map_size; sVar5 = sVar5 + 1) {
      cVar7 = (char)context_map[sVar5];
      for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
        if (*(char *)((long)histogram + uVar10) == cVar7) goto LAB_0011ec29;
      }
      cVar7 = *(char *)((long)histogram + uVar4);
      uVar10 = uVar4;
LAB_0011ec29:
      *(int *)((long)p + sVar5 * 4) = (int)uVar10;
      while (uVar10 != 0) {
        *(undefined1 *)((long)histogram + uVar10) = *(undefined1 *)((long)histogram + (uVar10 - 1));
        uVar10 = uVar10 - 1;
      }
      histogram[0]._0_1_ = cVar7;
    }
    sVar5 = 0;
    uVar4 = 0;
    while (uVar3 = (uint)uVar4, sVar5 < context_map_size) {
      for (; (uVar10 = context_map_size, context_map_size != sVar5 &&
             (uVar10 = sVar5, *(int *)((long)p + sVar5 * 4) != 0)); sVar5 = sVar5 + 1) {
      }
      sVar5 = context_map_size;
      if (context_map_size < uVar10) {
        sVar5 = uVar10;
      }
      uVar8 = (int)sVar5 - (int)uVar10;
      for (lVar9 = 0; (uVar10 - sVar5) + lVar9 != 0; lVar9 = lVar9 + 1) {
        if (*(int *)((long)p + lVar9 * 4 + uVar10 * 4) != 0) {
          sVar5 = uVar10 + lVar9;
          uVar8 = (uint)lVar9;
          break;
        }
      }
      if (uVar3 < uVar8) {
        uVar4 = (ulong)uVar8;
      }
    }
    uVar8 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar10 = 6;
    if (uVar8 < 6) {
      uVar10 = (ulong)uVar8;
    }
    if (uVar3 == 0) {
      uVar10 = uVar4;
    }
    uVar8 = (uint)uVar10;
    uVar3 = 2 << ((byte)uVar10 & 0x1f);
    lVar9 = 0;
    uVar4 = 0;
LAB_0011ecdd:
    if (uVar4 < context_map_size) {
      iVar1 = *(int *)((long)p + uVar4 * 4);
      if (iVar1 == 0) {
        uVar12 = (int)context_map_size - (int)uVar4;
        for (lVar6 = 1; uVar4 + lVar6 < context_map_size; lVar6 = lVar6 + 1) {
          if (*(int *)((long)p + lVar6 * 4 + uVar4 * 4) != 0) {
            uVar12 = (uint)lVar6;
            break;
          }
        }
        uVar4 = uVar4 + uVar12;
LAB_0011ed21:
        if (uVar12 != 0) {
          if (uVar3 <= uVar12) goto code_r0x0011ed2d;
          uVar2 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          *(uint *)((long)p + lVar9 * 4) = ((-1 << ((byte)uVar2 & 0x1f)) + uVar12) * 0x200 | uVar2;
          goto LAB_0011ed53;
        }
        goto LAB_0011ecdd;
      }
      *(uint *)((long)p + lVar9 * 4) = iVar1 + uVar8;
      uVar4 = uVar4 + 1;
LAB_0011ed53:
      lVar9 = lVar9 + 1;
      goto LAB_0011ecdd;
    }
    memset(histogram,0,0x440);
    for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
      histogram[*(uint *)((long)p + lVar6 * 4) & 0x1ff] =
           histogram[*(uint *)((long)p + lVar6 * 4) & 0x1ff] + 1;
    }
    uVar11 = *storage_ix;
    uVar4 = uVar11 + 1;
    *(ulong *)(storage + (uVar11 >> 3)) =
         (ulong)(uVar8 != 0) << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
    *storage_ix = uVar4;
    if (uVar8 != 0) {
      *(ulong *)(storage + (uVar4 >> 3)) =
           (ulong)(uVar8 - 1) << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
      *storage_ix = uVar11 + 5;
    }
    BuildAndStoreHuffmanTree
              (histogram,uVar10 + num_clusters,uVar10 + num_clusters,local_7b0,depths,bits,
               storage_ix,storage);
    for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
      uVar3 = *(uint *)((long)p + lVar6 * 4);
      uVar12 = uVar3 & 0x1ff;
      uVar10 = (ulong)uVar12;
      uVar4 = *storage_ix;
      uVar11 = depths[uVar10] + uVar4;
      *(ulong *)(storage + (uVar4 >> 3)) =
           (ulong)bits[uVar10] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
      *storage_ix = uVar11;
      if (uVar12 - 1 < uVar8) {
        *(ulong *)(storage + (uVar11 >> 3)) =
             (ulong)(uVar3 >> 9) << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
        *storage_ix = uVar10 + uVar11;
      }
    }
    uVar4 = *storage_ix;
    *(ulong *)(storage + (uVar4 >> 3)) = (ulong)storage[uVar4 >> 3] | 1L << ((byte)uVar4 & 7);
    *storage_ix = uVar4 + 1;
    BrotliFree(m,p);
  }
  return;
code_r0x0011ed2d:
  *(uint *)((long)p + lVar9 * 4) = ~(-1 << ((byte)uVar10 & 0x1f)) * 0x200 + uVar8;
  uVar12 = (uVar12 - uVar3) + 1;
  lVar9 = lVar9 + 1;
  goto LAB_0011ed21;
}

Assistant:

static void EncodeContextMap(MemoryManager* m,
                             const uint32_t* context_map,
                             size_t context_map_size,
                             size_t num_clusters,
                             HuffmanTree* tree,
                             size_t* storage_ix, uint8_t* storage) {
  size_t i;
  uint32_t* rle_symbols;
  uint32_t max_run_length_prefix = 6;
  size_t num_rle_symbols = 0;
  uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  static const uint32_t kSymbolMask = (1u << SYMBOL_BITS) - 1u;
  uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];

  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  rle_symbols = BROTLI_ALLOC(m, uint32_t, context_map_size);
  if (BROTLI_IS_OOM(m)) return;
  MoveToFrontTransform(context_map, context_map_size, rle_symbols);
  RunLengthCodeZeros(context_map_size, rle_symbols,
                     &num_rle_symbols, &max_run_length_prefix);
  memset(histogram, 0, sizeof(histogram));
  for (i = 0; i < num_rle_symbols; ++i) {
    ++histogram[rle_symbols[i] & kSymbolMask];
  }
  {
    BROTLI_BOOL use_rle = TO_BROTLI_BOOL(max_run_length_prefix > 0);
    BrotliWriteBits(1, (uint64_t)use_rle, storage_ix, storage);
    if (use_rle) {
      BrotliWriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
    }
  }
  BuildAndStoreHuffmanTree(histogram, num_clusters + max_run_length_prefix,
                           num_clusters + max_run_length_prefix,
                           tree, depths, bits, storage_ix, storage);
  for (i = 0; i < num_rle_symbols; ++i) {
    const uint32_t rle_symbol = rle_symbols[i] & kSymbolMask;
    const uint32_t extra_bits_val = rle_symbols[i] >> SYMBOL_BITS;
    BrotliWriteBits(depths[rle_symbol], bits[rle_symbol], storage_ix, storage);
    if (rle_symbol > 0 && rle_symbol <= max_run_length_prefix) {
      BrotliWriteBits(rle_symbol, extra_bits_val, storage_ix, storage);
    }
  }
  BrotliWriteBits(1, 1, storage_ix, storage);  /* use move-to-front */
  BROTLI_FREE(m, rle_symbols);
}